

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nw_striped_avx2_256_8.c
# Opt level: O3

parasail_result_t *
parasail_nw_striped_profile_avx2_256_8
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  void *pvVar1;
  parasail_matrix_t *ppVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  __m256i alVar14;
  int iVar15;
  parasail_result_t *ppVar16;
  __m256i *palVar17;
  __m256i *ptr;
  __m256i *ptr_00;
  int8_t *ptr_01;
  int iVar18;
  char cVar19;
  uint uVar20;
  uint uVar21;
  ulong uVar22;
  __m256i *palVar23;
  __m256i *palVar24;
  int iVar25;
  ulong size;
  char cVar26;
  long lVar27;
  int iVar28;
  undefined1 uVar29;
  undefined1 uVar30;
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [16];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [64];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [64];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [16];
  undefined1 auVar55 [32];
  undefined1 auVar56 [16];
  undefined1 auVar57 [32];
  undefined1 local_218 [32];
  undefined1 local_1f8 [32];
  undefined1 local_1b8 [32];
  undefined1 local_198 [32];
  undefined1 local_178 [32];
  undefined1 local_158 [32];
  undefined1 local_138 [32];
  undefined1 local_f8 [32];
  undefined1 auVar58 [64];
  
  if (profile == (parasail_profile_t *)0x0) {
    parasail_nw_striped_profile_avx2_256_8_cold_8();
  }
  else {
    pvVar1 = (profile->profile8).score;
    if (pvVar1 == (void *)0x0) {
      parasail_nw_striped_profile_avx2_256_8_cold_7();
    }
    else {
      ppVar2 = profile->matrix;
      if (ppVar2 == (parasail_matrix_t *)0x0) {
        parasail_nw_striped_profile_avx2_256_8_cold_6();
      }
      else {
        uVar20 = profile->s1Len;
        if ((int)uVar20 < 1) {
          parasail_nw_striped_profile_avx2_256_8_cold_5();
        }
        else if (s2 == (char *)0x0) {
          parasail_nw_striped_profile_avx2_256_8_cold_4();
        }
        else if (s2Len < 1) {
          parasail_nw_striped_profile_avx2_256_8_cold_3();
        }
        else if (open < 0) {
          parasail_nw_striped_profile_avx2_256_8_cold_2();
        }
        else if (gap < 0) {
          parasail_nw_striped_profile_avx2_256_8_cold_1();
        }
        else {
          uVar21 = uVar20 - 1;
          size = (ulong)uVar20 + 0x1f >> 5;
          iVar28 = ppVar2->min;
          local_158._4_4_ = -open;
          uVar20 = (uint)(byte)-(char)iVar28;
          if (iVar28 != local_158._4_4_ && SBORROW4(iVar28,local_158._4_4_) == iVar28 + open < 0) {
            uVar20 = open;
          }
          cVar26 = '~' - (char)ppVar2->max;
          ppVar16 = parasail_result_new();
          if (ppVar16 != (parasail_result_t *)0x0) {
            iVar28 = (int)(uVar21 / size);
            ppVar16->flag = ppVar16->flag | 0x20100801;
            palVar17 = parasail_memalign___m256i(0x20,size);
            ptr = parasail_memalign___m256i(0x20,size);
            ptr_00 = parasail_memalign___m256i(0x20,size);
            ptr_01 = parasail_memalign_int8_t(0x20,(ulong)(s2Len + 1));
            if ((ptr_01 != (int8_t *)0x0 && ptr_00 != (__m256i *)0x0) &&
                (ptr != (__m256i *)0x0 && palVar17 != (__m256i *)0x0)) {
              iVar18 = s2Len + -1;
              uVar29 = (undefined1)open;
              uVar30 = (undefined1)gap;
              auVar33[1] = uVar30;
              auVar33[0] = uVar30;
              auVar33[2] = uVar30;
              auVar33[3] = uVar30;
              auVar33[4] = uVar30;
              auVar33[5] = uVar30;
              auVar33[6] = uVar30;
              auVar33[7] = uVar30;
              auVar33[8] = uVar30;
              auVar33[9] = uVar30;
              auVar33[10] = uVar30;
              auVar33[0xb] = uVar30;
              auVar33[0xc] = uVar30;
              auVar33[0xd] = uVar30;
              auVar33[0xe] = uVar30;
              auVar33[0xf] = uVar30;
              auVar33[0x10] = uVar30;
              auVar33[0x11] = uVar30;
              auVar33[0x12] = uVar30;
              auVar33[0x13] = uVar30;
              auVar33[0x14] = uVar30;
              auVar33[0x15] = uVar30;
              auVar33[0x16] = uVar30;
              auVar33[0x17] = uVar30;
              auVar33[0x18] = uVar30;
              auVar33[0x19] = uVar30;
              auVar33[0x1a] = uVar30;
              auVar33[0x1b] = uVar30;
              auVar33[0x1c] = uVar30;
              auVar33[0x1d] = uVar30;
              auVar33[0x1e] = uVar30;
              auVar33[0x1f] = uVar30;
              cVar19 = (char)uVar20 + -0x7f;
              auVar32._4_4_ = 0;
              auVar32._0_4_ = open;
              auVar31._4_4_ = 0;
              auVar31._0_4_ = gap;
              local_f8._8_8_ = SEXT48((int)local_158._4_4_);
              auVar31._8_4_ = gap;
              auVar31._12_4_ = 0;
              auVar31._16_4_ = gap;
              auVar31._20_4_ = 0;
              auVar31._24_4_ = gap;
              auVar31._28_4_ = 0;
              local_f8._0_8_ = local_f8._8_8_;
              local_f8._16_8_ = local_f8._8_8_;
              local_f8._24_8_ = local_f8._8_8_;
              auVar43._8_8_ = size;
              auVar43._0_8_ = size;
              auVar43._16_8_ = size;
              auVar43._24_8_ = size;
              auVar5 = vpmuldq_avx2(auVar43,_DAT_00908f20);
              auVar6 = vpmuldq_avx2(auVar43,_DAT_00908f40);
              auVar7 = vpmuldq_avx2(auVar43,_DAT_00908f60);
              auVar36 = vpmuldq_avx2(auVar43,_DAT_00908f80);
              auVar45 = vpmuldq_avx2(auVar43,_DAT_00908e00);
              auVar46 = vpmuldq_avx2(auVar43,_DAT_00908e20);
              auVar37 = vpmuldq_avx2(auVar43,_DAT_00908c60);
              auVar43 = vpmuldq_avx2(auVar43,_DAT_00908b60);
              auVar32._8_4_ = open;
              auVar32._12_4_ = 0;
              auVar32._16_4_ = open;
              auVar32._20_4_ = 0;
              auVar32._24_4_ = open;
              auVar32._28_4_ = 0;
              uVar22 = 0;
              auVar55._8_8_ = 0xffffffffffffff80;
              auVar55._0_8_ = 0xffffffffffffff80;
              auVar55._16_8_ = 0xffffffffffffff80;
              auVar55._24_8_ = 0xffffffffffffff80;
              auVar57._8_8_ = 0xff;
              auVar57._0_8_ = 0xff;
              auVar57._16_8_ = 0xff;
              auVar57._24_8_ = 0xff;
              palVar23 = palVar17;
              palVar24 = ptr_00;
              do {
                auVar44._8_8_ = uVar22;
                auVar44._0_8_ = uVar22;
                auVar44._16_8_ = uVar22;
                auVar44._24_8_ = uVar22;
                auVar35 = vpaddq_avx2(auVar44,auVar37);
                auVar47 = vpaddq_avx2(auVar44,auVar43);
                auVar48 = vpaddq_avx2(auVar44,auVar46);
                auVar49 = vpaddq_avx2(auVar44,auVar45);
                auVar50 = vpaddq_avx2(auVar44,auVar36);
                auVar52 = vpaddq_avx2(auVar44,auVar7);
                auVar53 = vpaddq_avx2(auVar44,auVar6);
                auVar44 = vpaddq_avx2(auVar44,auVar5);
                auVar8 = vpmuludq_avx2(auVar44,auVar31);
                auVar44 = vpsrlq_avx2(auVar44,0x20);
                auVar44 = vpmuludq_avx2(auVar44,auVar31);
                auVar44 = vpsllq_avx2(auVar44,0x20);
                auVar44 = vpaddq_avx2(auVar8,auVar44);
                auVar8 = vpmuludq_avx2(auVar53,auVar31);
                auVar53 = vpsrlq_avx2(auVar53,0x20);
                auVar53 = vpmuludq_avx2(auVar53,auVar31);
                auVar53 = vpsllq_avx2(auVar53,0x20);
                auVar53 = vpaddq_avx2(auVar8,auVar53);
                auVar8 = vpmuludq_avx2(auVar52,auVar31);
                auVar52 = vpsrlq_avx2(auVar52,0x20);
                auVar52 = vpmuludq_avx2(auVar52,auVar31);
                auVar52 = vpsllq_avx2(auVar52,0x20);
                auVar52 = vpaddq_avx2(auVar8,auVar52);
                auVar8 = vpmuludq_avx2(auVar50,auVar31);
                auVar50 = vpsrlq_avx2(auVar50,0x20);
                auVar50 = vpmuludq_avx2(auVar50,auVar31);
                auVar50 = vpsllq_avx2(auVar50,0x20);
                auVar50 = vpaddq_avx2(auVar8,auVar50);
                auVar8 = vpmuludq_avx2(auVar49,auVar31);
                auVar49 = vpsrlq_avx2(auVar49,0x20);
                auVar49 = vpmuludq_avx2(auVar49,auVar31);
                auVar49 = vpsllq_avx2(auVar49,0x20);
                auVar49 = vpaddq_avx2(auVar8,auVar49);
                auVar8 = vpmuludq_avx2(auVar48,auVar31);
                auVar48 = vpsrlq_avx2(auVar48,0x20);
                auVar48 = vpmuludq_avx2(auVar48,auVar31);
                auVar48 = vpsllq_avx2(auVar48,0x20);
                auVar48 = vpaddq_avx2(auVar8,auVar48);
                auVar8 = vpmuludq_avx2(auVar47,auVar31);
                auVar47 = vpsrlq_avx2(auVar47,0x20);
                auVar47 = vpmuludq_avx2(auVar47,auVar31);
                auVar47 = vpsllq_avx2(auVar47,0x20);
                auVar47 = vpaddq_avx2(auVar8,auVar47);
                auVar8 = vpmuludq_avx2(auVar35,auVar31);
                auVar35 = vpsrlq_avx2(auVar35,0x20);
                auVar35 = vpmuludq_avx2(auVar35,auVar31);
                auVar35 = vpsllq_avx2(auVar35,0x20);
                auVar35 = vpaddq_avx2(auVar8,auVar35);
                auVar9 = vpsubq_avx2(local_f8,auVar35);
                auVar10 = vpsubq_avx2(local_f8,auVar47);
                auVar11 = vpsubq_avx2(local_f8,auVar48);
                auVar12 = vpsubq_avx2(local_f8,auVar49);
                auVar44 = vpsubq_avx2(local_f8,auVar44);
                auVar35 = vpcmpgtq_avx2(auVar44,auVar55);
                auVar48 = vblendvpd_avx(auVar55,auVar44,auVar35);
                auVar13 = vpsubq_avx2(local_f8,auVar50);
                auVar35 = vpcmpgtq_avx2(auVar12,auVar55);
                auVar49 = vblendvpd_avx(auVar55,auVar12,auVar35);
                auVar52 = vpsubq_avx2(local_f8,auVar52);
                auVar35 = vpcmpgtq_avx2(auVar10,auVar55);
                auVar47 = vblendvpd_avx(auVar55,auVar10,auVar35);
                auVar53 = vpsubq_avx2(local_f8,auVar53);
                auVar35 = vpcmpgtq_avx2(auVar9,auVar55);
                auVar35 = vblendvpd_avx(auVar55,auVar9,auVar35);
                auVar35 = vandpd_avx(auVar35,auVar57);
                auVar47 = vandpd_avx(auVar47,auVar57);
                auVar50 = vpackusdw_avx2(auVar47,auVar35);
                auVar35 = vpcmpgtq_avx2(auVar11,auVar55);
                auVar35 = vblendvpd_avx(auVar55,auVar11,auVar35);
                auVar35 = vandpd_avx(auVar35,auVar57);
                auVar47 = vandpd_avx(auVar57,auVar49);
                auVar35 = vpackusdw_avx2(auVar35,auVar47);
                auVar47 = vpcmpgtq_avx2(auVar52,auVar55);
                auVar47 = vblendvpd_avx(auVar55,auVar52,auVar47);
                auVar49 = vpermq_avx2(auVar50,0xd8);
                auVar35 = vpermq_avx2(auVar35,0xd8);
                auVar8 = vpackusdw_avx2(auVar49,auVar35);
                auVar35 = vpcmpgtq_avx2(auVar13,auVar55);
                auVar35 = vblendvpd_avx(auVar55,auVar13,auVar35);
                auVar35 = vandpd_avx(auVar57,auVar35);
                auVar47 = vandpd_avx(auVar47,auVar57);
                auVar49 = vpackusdw_avx2(auVar35,auVar47);
                auVar35 = vpcmpgtq_avx2(auVar53,auVar55);
                auVar35 = vblendvpd_avx(auVar55,auVar53,auVar35);
                auVar35 = vandpd_avx(auVar35,auVar57);
                auVar47 = vandpd_avx(auVar57,auVar48);
                auVar35 = vpackusdw_avx2(auVar35,auVar47);
                auVar47 = vpermq_avx2(auVar49,0xd8);
                auVar35 = vpermq_avx2(auVar35,0xd8);
                auVar4 = vpackusdw_avx2(auVar47,auVar35);
                auVar9 = vpsubq_avx2(auVar9,auVar32);
                auVar47 = vpsubq_avx2(auVar10,auVar32);
                auVar48 = vpsubq_avx2(auVar44,auVar32);
                auVar35 = vpcmpgtq_avx2(auVar48,auVar55);
                auVar48 = vblendvpd_avx(auVar55,auVar48,auVar35);
                auVar49 = vpsubq_avx2(auVar53,auVar32);
                auVar35 = vpcmpgtq_avx2(auVar49,auVar55);
                auVar49 = vblendvpd_avx(auVar55,auVar49,auVar35);
                auVar50 = vpsubq_avx2(auVar52,auVar32);
                auVar35 = vpcmpgtq_avx2(auVar50,auVar55);
                auVar50 = vblendvpd_avx(auVar55,auVar50,auVar35);
                auVar52 = vpsubq_avx2(auVar13,auVar32);
                auVar35 = vpcmpgtq_avx2(auVar52,auVar55);
                auVar52 = vblendvpd_avx(auVar55,auVar52,auVar35);
                auVar53 = vpsubq_avx2(auVar12,auVar32);
                auVar35 = vpcmpgtq_avx2(auVar53,auVar55);
                auVar53 = vblendvpd_avx(auVar55,auVar53,auVar35);
                auVar44 = vpsubq_avx2(auVar11,auVar32);
                auVar35 = vpcmpgtq_avx2(auVar44,auVar55);
                auVar44 = vblendvpd_avx(auVar55,auVar44,auVar35);
                auVar35 = vpcmpgtq_avx2(auVar47,auVar55);
                auVar47 = vblendvpd_avx(auVar55,auVar47,auVar35);
                auVar35 = vpcmpgtq_avx2(auVar9,auVar55);
                auVar35 = vblendvpd_avx(auVar55,auVar9,auVar35);
                auVar8 = vpermq_avx2(auVar8,0xd8);
                auVar4 = vpermq_avx2(auVar4,0xd8);
                auVar4 = vpackuswb_avx2(auVar8,auVar4);
                auVar51 = ZEXT3264(auVar4);
                auVar35 = vandpd_avx(auVar57,auVar35);
                auVar47 = vandpd_avx(auVar47,auVar57);
                auVar8 = vpackusdw_avx2(auVar47,auVar35);
                auVar35 = vandpd_avx(auVar44,auVar57);
                auVar47 = vandpd_avx(auVar57,auVar53);
                auVar35 = vpackusdw_avx2(auVar35,auVar47);
                auVar47 = vpermq_avx2(auVar8,0xd8);
                auVar35 = vpermq_avx2(auVar35,0xd8);
                auVar53 = vpackusdw_avx2(auVar47,auVar35);
                auVar35 = vandpd_avx(auVar57,auVar52);
                auVar47 = vandpd_avx(auVar50,auVar57);
                auVar50 = vpackusdw_avx2(auVar35,auVar47);
                auVar35 = vandpd_avx(auVar57,auVar49);
                auVar47 = vandpd_avx(auVar57,auVar48);
                auVar35 = vpackusdw_avx2(auVar35,auVar47);
                auVar47 = vpermq_avx2(auVar50,0xd8);
                auVar35 = vpermq_avx2(auVar35,0xd8);
                auVar35 = vpackusdw_avx2(auVar47,auVar35);
                alVar14 = (__m256i)vpermq_avx2(auVar4,0xd8);
                *palVar23 = alVar14;
                auVar47 = vpermq_avx2(auVar53,0xd8);
                auVar35 = vpermq_avx2(auVar35,0xd8);
                auVar35 = vpackuswb_avx2(auVar47,auVar35);
                alVar14 = (__m256i)vpermq_avx2(auVar35,0xd8);
                *palVar24 = alVar14;
                uVar22 = uVar22 + 1;
                palVar24 = palVar24 + 1;
                palVar23 = palVar23 + 1;
              } while (size != uVar22);
              *ptr_01 = '\0';
              lVar27 = (ulong)(uint)s2Len - 1;
              auVar34._8_8_ = lVar27;
              auVar34._0_8_ = lVar27;
              auVar36._16_8_ = lVar27;
              auVar36._0_16_ = auVar34;
              auVar36._24_8_ = lVar27;
              local_138._4_4_ = gap;
              local_138._0_4_ = gap;
              local_138._8_4_ = gap;
              local_138._12_4_ = gap;
              local_138._16_4_ = gap;
              local_138._20_4_ = gap;
              local_138._24_4_ = gap;
              local_138._28_4_ = gap;
              local_158._0_4_ = local_158._4_4_;
              local_158._8_4_ = local_158._4_4_;
              local_158._12_4_ = local_158._4_4_;
              local_158._16_4_ = local_158._4_4_;
              local_158._20_4_ = local_158._4_4_;
              local_158._24_4_ = local_158._4_4_;
              local_158._28_4_ = local_158._4_4_;
              auVar7 = vpmovsxbd_avx2(ZEXT816(0x201f1e1d1c1b1a19));
              local_218._8_8_ = 0x1400000013;
              local_218._0_8_ = 0x1200000011;
              local_218._16_8_ = 0x1600000015;
              local_218._24_8_ = 0x1800000017;
              auVar6 = vpmovsxbd_avx2(ZEXT816(0x100f0e0d0c0b0a09));
              auVar5 = vpmovsxbd_avx2(ZEXT816(0x807060504030201));
              uVar22 = 0;
              auVar54._8_8_ = 0x8000000000000000;
              auVar54._0_8_ = 0x8000000000000000;
              local_178._8_4_ = 0xffffff80;
              local_178._0_8_ = 0xffffff80ffffff80;
              local_178._12_4_ = 0xffffff80;
              local_178._16_4_ = 0xffffff80;
              local_178._20_4_ = 0xffffff80;
              local_178._24_4_ = 0xffffff80;
              local_178._28_4_ = 0xffffff80;
              local_198._8_4_ = 0xff;
              local_198._0_8_ = 0xff000000ff;
              local_198._12_4_ = 0xff;
              local_198._16_4_ = 0xff;
              local_198._20_4_ = 0xff;
              local_198._24_4_ = 0xff;
              local_198._28_4_ = 0xff;
              auVar56._8_4_ = 4;
              auVar56._0_8_ = 0x400000004;
              auVar56._12_4_ = 4;
              auVar58 = ZEXT1664(auVar56);
              local_1f8._8_4_ = 0x20;
              local_1f8._0_8_ = 0x2000000020;
              local_1f8._12_4_ = 0x20;
              local_1f8._16_4_ = 0x20;
              local_1f8._20_4_ = 0x20;
              local_1f8._24_4_ = 0x20;
              local_1f8._28_4_ = 0x20;
              local_1b8._8_8_ = 0x8000000000000000;
              local_1b8._0_8_ = 0x8000000000000000;
              local_1b8._16_8_ = 0x8000000000000000;
              local_1b8._24_8_ = 0x8000000000000000;
              auVar45 = ZEXT1632(auVar56);
              do {
                auVar35._8_8_ = uVar22;
                auVar35._0_8_ = uVar22;
                auVar35._16_8_ = uVar22;
                auVar35._24_8_ = uVar22;
                auVar32 = vpor_avx2(auVar35,_DAT_00908b60);
                auVar46 = vpaddd_avx2(auVar5,_DAT_00909280);
                auVar43 = vpcmpeqd_avx2(auVar51._0_32_,auVar51._0_32_);
                auVar37 = vpaddd_avx2(auVar6,auVar43);
                auVar43 = vpaddd_avx2(auVar43,auVar7);
                auVar31 = vpmulld_avx2(auVar43,local_138);
                auVar37 = vpmulld_avx2(auVar37,local_138);
                auVar46 = vpmulld_avx2(auVar46,local_138);
                auVar56 = vpcmpgtq_avx(auVar54 ^ auVar32._0_16_,auVar54 ^ auVar34);
                auVar46 = vpsubd_avx2(local_158,auVar46);
                auVar37 = vpsubd_avx2(local_158,auVar37);
                auVar43 = vpcmpeqd_avx2(auVar58._0_32_,auVar58._0_32_);
                auVar37 = vpmaxsd_avx2(auVar37,local_178);
                auVar46 = vpmaxsd_avx2(auVar46,local_178);
                auVar46 = vpand_avx2(local_198,auVar46);
                auVar37 = vpand_avx2(auVar37,local_198);
                auVar46 = vpackusdw_avx2(auVar46,auVar37);
                auVar37 = vpaddd_avx2(auVar43,local_218);
                auVar37 = vpmulld_avx2(auVar37,local_138);
                auVar37 = vpsubd_avx2(local_158,auVar37);
                auVar43 = vpsubd_avx2(local_158,auVar31);
                auVar3 = vpcmpeqd_avx(local_158._0_16_,local_158._0_16_);
                auVar51 = ZEXT1664(auVar3);
                auVar43 = vpmaxsd_avx2(auVar43,local_178);
                auVar37 = vpmaxsd_avx2(auVar37,local_178);
                auVar37 = vpand_avx2(auVar37,local_198);
                auVar43 = vpand_avx2(local_198,auVar43);
                auVar37 = vpackusdw_avx2(auVar37,auVar43);
                auVar46 = vpermq_avx2(auVar46,0xd8);
                auVar37 = vpermq_avx2(auVar37,0xd8);
                auVar46 = vpackuswb_avx2(auVar46,auVar37);
                auVar56 = vpackssdw_avx(auVar56,auVar56);
                auVar56 = vpackssdw_avx(auVar3 ^ auVar56,auVar3 ^ auVar56);
                auVar56 = vpacksswb_avx(auVar56,auVar56);
                auVar46 = vpermq_avx2(auVar46,0xd8);
                if ((auVar56 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  ptr_01[uVar22 + 1] = auVar46[0];
                }
                auVar56 = vpcmpgtq_avx(auVar54 ^ auVar32._0_16_,auVar54 ^ auVar34);
                auVar56 = vpackssdw_avx(auVar56,auVar56);
                auVar56 = vpackssdw_avx(auVar3 ^ auVar56,auVar3 ^ auVar56);
                auVar56 = vpacksswb_avx(auVar56,auVar56);
                auVar58 = ZEXT3264(auVar45);
                if ((auVar56 >> 8 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  ptr_01[uVar22 + 2] = auVar46[1];
                }
                auVar31 = local_1b8 ^ auVar36;
                auVar37 = vpcmpgtq_avx2(local_1b8 ^ auVar32,auVar31);
                auVar43 = vpshuflw_avx2(auVar37,0xe8);
                auVar43 = vpermd_avx2(auVar45,auVar43 ^ _DAT_00909280);
                auVar56 = vpackssdw_avx(auVar43._0_16_,auVar43._0_16_);
                auVar56 = vpacksswb_avx(auVar56,auVar56);
                if ((auVar56 >> 0x10 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  ptr_01[uVar22 + 3] = auVar46[2];
                }
                auVar56 = vpackssdw_avx(auVar37._16_16_,auVar37._16_16_);
                auVar56 = vpackssdw_avx(auVar3 ^ auVar56,auVar3 ^ auVar56);
                auVar56 = vpacksswb_avx(auVar56,auVar56);
                if ((auVar56 >> 0x18 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  ptr_01[uVar22 + 4] = auVar46[3];
                }
                auVar43 = vpor_avx2(auVar35,_DAT_00908c60);
                auVar56 = vpcmpgtq_avx(auVar54 ^ auVar43._0_16_,auVar54 ^ auVar34);
                auVar56 = vpackssdw_avx(auVar56,auVar56);
                auVar37 = vpermq_avx2(ZEXT1632(auVar3 ^ auVar56),0x55);
                auVar37 = vpackssdw_avx2(auVar37,auVar43);
                auVar39._0_2_ = auVar37._16_2_;
                auVar39._2_2_ = auVar39._0_2_;
                auVar39._4_2_ = auVar39._0_2_;
                auVar39._6_2_ = auVar39._0_2_;
                auVar39._8_2_ = auVar39._0_2_;
                auVar39._10_2_ = auVar39._0_2_;
                auVar39._12_2_ = auVar39._0_2_;
                auVar39._14_2_ = auVar39._0_2_;
                auVar56 = vpacksswb_avx(auVar39,auVar39);
                if ((auVar56 >> 0x20 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  ptr_01[uVar22 + 5] = auVar46[4];
                }
                auVar56 = vpcmpgtq_avx(auVar54 ^ auVar43._0_16_,auVar54 ^ auVar34);
                auVar56 = vpshufhw_avx(auVar56,0x84);
                auVar37 = vpermq_avx2(ZEXT1632(auVar3 ^ auVar56),0x55);
                auVar37 = vpackssdw_avx2(auVar37,auVar43);
                auVar40._0_4_ = auVar37._16_4_;
                auVar40._4_4_ = auVar40._0_4_;
                auVar40._8_4_ = auVar40._0_4_;
                auVar40._12_4_ = auVar40._0_4_;
                auVar56 = vpacksswb_avx(auVar40,auVar40);
                if ((auVar56 >> 0x28 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  ptr_01[uVar22 + 6] = auVar46[5];
                }
                auVar43 = vpcmpgtq_avx2(local_1b8 ^ auVar43,auVar31);
                auVar37 = vpackssdw_avx2(auVar43,auVar43);
                auVar56 = auVar3 ^ auVar37._16_16_;
                auVar56 = vpackssdw_avx(auVar56,auVar56);
                auVar56 = vpacksswb_avx(auVar56,auVar56);
                if ((auVar56 >> 0x30 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  ptr_01[uVar22 + 7] = auVar46[6];
                }
                auVar37 = vpshufhw_avx2(auVar43,0x84);
                auVar56 = auVar3 ^ auVar37._16_16_;
                auVar56 = vpackssdw_avx(auVar56,auVar56);
                auVar56 = vpacksswb_avx(auVar56,auVar56);
                if ((auVar56 >> 0x38 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  ptr_01[uVar22 + 8] = auVar46[7];
                }
                auVar43 = vpor_avx2(auVar35,_DAT_00908e20);
                auVar56 = vpcmpgtq_avx(auVar54 ^ auVar43._0_16_,auVar54 ^ auVar34);
                auVar56 = vpackssdw_avx(auVar56,auVar56);
                auVar56 = vpackssdw_avx(auVar3 ^ auVar56,auVar3 ^ auVar56);
                auVar37 = vpmovzxwd_avx2(auVar56);
                auVar37 = vpacksswb_avx2(auVar37,auVar43);
                if ((auVar37 & (undefined1  [32])0x1) != (undefined1  [32])0x0) {
                  ptr_01[uVar22 + 9] = auVar46[0];
                }
                auVar56 = vpcmpgtq_avx(auVar54 ^ auVar43._0_16_,auVar54 ^ auVar34);
                auVar56 = vpackssdw_avx(auVar56,auVar56);
                auVar56 = vpackssdw_avx(auVar3 ^ auVar56,auVar3 ^ auVar56);
                auVar37 = vpermq_avx2(ZEXT1632(auVar56),0x55);
                auVar37 = vpacksswb_avx2(auVar37,auVar43);
                if ((auVar37._16_16_ >> 8 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  ptr_01[uVar22 + 10] = auVar46[1];
                }
                auVar43 = vpcmpgtq_avx2(local_1b8 ^ auVar43,auVar31);
                auVar37 = vpshuflw_avx2(auVar43,0xe8);
                auVar37 = vpermd_avx2(auVar45,auVar37 ^ _DAT_00909280);
                auVar56 = vpackssdw_avx(auVar37._0_16_,auVar37._0_16_);
                auVar37 = vpermq_avx2(ZEXT1632(auVar56),0x55);
                auVar37 = vpacksswb_avx2(auVar37,auVar43);
                if ((auVar37._16_16_ >> 0x10 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  ptr_01[uVar22 + 0xb] = auVar46[2];
                }
                auVar56 = vpackssdw_avx(auVar43._16_16_,auVar43._16_16_);
                auVar56 = vpackssdw_avx(auVar3 ^ auVar56,auVar3 ^ auVar56);
                auVar37 = vpermq_avx2(ZEXT1632(auVar56),0x55);
                auVar37 = vpacksswb_avx2(auVar37,auVar37);
                if ((auVar37._16_16_ >> 0x18 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  ptr_01[uVar22 + 0xc] = auVar46[3];
                }
                auVar43 = vpor_avx2(auVar35,_DAT_00908e00);
                auVar56 = vpcmpgtq_avx(auVar54 ^ auVar43._0_16_,auVar54 ^ auVar34);
                auVar56 = vpackssdw_avx(auVar56,auVar56);
                auVar37 = vpermq_avx2(ZEXT1632(auVar3 ^ auVar56),0x55);
                auVar37 = vpackssdw_avx2(auVar43,auVar37);
                auVar37 = vpacksswb_avx2(auVar37,auVar43);
                if ((auVar37._16_16_ >> 0x20 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  ptr_01[uVar22 + 0xd] = auVar46[4];
                }
                auVar56 = vpcmpgtq_avx(auVar54 ^ auVar43._0_16_,auVar54 ^ auVar34);
                auVar56 = vpshufhw_avx(auVar56,0x84);
                auVar37 = vpermq_avx2(ZEXT1632(auVar3 ^ auVar56),0x55);
                auVar37 = vpackssdw_avx2(auVar43,auVar37);
                auVar37 = vpacksswb_avx2(auVar37,auVar43);
                if ((auVar37._16_16_ >> 0x28 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  ptr_01[uVar22 + 0xe] = auVar46[5];
                }
                auVar43 = vpcmpgtq_avx2(local_1b8 ^ auVar43,auVar31);
                auVar37 = vpackssdw_avx2(auVar43,auVar43);
                auVar37 = vpackssdw_avx2(auVar43,auVar37 ^ _DAT_00909280);
                auVar37 = vpacksswb_avx2(auVar37,auVar43);
                if ((auVar37._16_16_ >> 0x30 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  ptr_01[uVar22 + 0xf] = auVar46[6];
                }
                auVar37 = vpshufhw_avx2(auVar43,0x84);
                auVar37 = vpackssdw_avx2(auVar37 ^ _DAT_00909280,auVar37 ^ _DAT_00909280);
                auVar37 = vpacksswb_avx2(auVar37,auVar37);
                if ((auVar37._16_16_ >> 0x38 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  ptr_01[uVar22 + 0x10] = auVar46[7];
                }
                auVar37 = vpor_avx2(auVar35,_DAT_00908f80);
                auVar56 = vpcmpgtq_avx(auVar54 ^ auVar37._0_16_,auVar54 ^ auVar34);
                auVar56 = vpackssdw_avx(auVar56,auVar56);
                auVar56 = vpackssdw_avx(auVar3 ^ auVar56,auVar3 ^ auVar56);
                auVar56 = vpacksswb_avx(auVar56,auVar56);
                if ((auVar56 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  ptr_01[uVar22 + 0x11] = auVar46[0x10];
                }
                auVar56 = vpcmpgtq_avx(auVar54 ^ auVar37._0_16_,auVar54 ^ auVar34);
                auVar56 = vpackssdw_avx(auVar56,auVar56);
                auVar56 = vpackssdw_avx(auVar3 ^ auVar56,auVar3 ^ auVar56);
                auVar56 = vpacksswb_avx(auVar56,auVar56);
                if ((auVar56 >> 8 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  ptr_01[uVar22 + 0x12] = auVar46[0x11];
                }
                auVar37 = vpcmpgtq_avx2(local_1b8 ^ auVar37,auVar31);
                auVar43 = vpshuflw_avx2(auVar37,0xe8);
                auVar43 = vpermd_avx2(auVar45,auVar43 ^ _DAT_00909280);
                auVar56 = vpackssdw_avx(auVar43._0_16_,auVar43._0_16_);
                auVar56 = vpacksswb_avx(auVar56,auVar56);
                if ((auVar56 >> 0x10 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  ptr_01[uVar22 + 0x13] = auVar46[0x12];
                }
                auVar56 = vpackssdw_avx(auVar37._16_16_,auVar37._16_16_);
                auVar56 = vpackssdw_avx(auVar3 ^ auVar56,auVar3 ^ auVar56);
                auVar56 = vpacksswb_avx(auVar56,auVar56);
                if ((auVar56 >> 0x18 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  ptr_01[uVar22 + 0x14] = auVar46[0x13];
                }
                auVar43 = vpor_avx2(auVar35,_DAT_00908f60);
                auVar56 = vpcmpgtq_avx(auVar54 ^ auVar43._0_16_,auVar54 ^ auVar34);
                auVar56 = vpackssdw_avx(auVar56,auVar56);
                auVar37 = vpermq_avx2(ZEXT1632(auVar3 ^ auVar56),0x55);
                auVar37 = vpackssdw_avx2(auVar37,auVar43);
                auVar41._0_2_ = auVar37._16_2_;
                auVar41._2_2_ = auVar41._0_2_;
                auVar41._4_2_ = auVar41._0_2_;
                auVar41._6_2_ = auVar41._0_2_;
                auVar41._8_2_ = auVar41._0_2_;
                auVar41._10_2_ = auVar41._0_2_;
                auVar41._12_2_ = auVar41._0_2_;
                auVar41._14_2_ = auVar41._0_2_;
                auVar56 = vpacksswb_avx(auVar41,auVar41);
                if ((auVar56 >> 0x20 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  ptr_01[uVar22 + 0x15] = auVar46[0x14];
                }
                auVar56 = vpcmpgtq_avx(auVar54 ^ auVar43._0_16_,auVar54 ^ auVar34);
                auVar56 = vpshufhw_avx(auVar56,0x84);
                auVar37 = vpermq_avx2(ZEXT1632(auVar3 ^ auVar56),0x55);
                auVar37 = vpackssdw_avx2(auVar37,auVar43);
                auVar42._0_4_ = auVar37._16_4_;
                auVar42._4_4_ = auVar42._0_4_;
                auVar42._8_4_ = auVar42._0_4_;
                auVar42._12_4_ = auVar42._0_4_;
                auVar56 = vpacksswb_avx(auVar42,auVar42);
                if ((auVar56 >> 0x28 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  ptr_01[uVar22 + 0x16] = auVar46[0x15];
                }
                auVar43 = vpcmpgtq_avx2(local_1b8 ^ auVar43,auVar31);
                auVar37 = vpackssdw_avx2(auVar43,auVar43);
                auVar56 = auVar3 ^ auVar37._16_16_;
                auVar56 = vpackssdw_avx(auVar56,auVar56);
                auVar56 = vpacksswb_avx(auVar56,auVar56);
                if ((auVar56 >> 0x30 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  ptr_01[uVar22 + 0x17] = auVar46[0x16];
                }
                auVar37 = vpshufhw_avx2(auVar43,0x84);
                auVar56 = auVar3 ^ auVar37._16_16_;
                auVar56 = vpackssdw_avx(auVar56,auVar56);
                auVar56 = vpacksswb_avx(auVar56,auVar56);
                if ((auVar56 >> 0x38 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  ptr_01[uVar22 + 0x18] = auVar46[0x17];
                }
                auVar43 = vpor_avx2(auVar35,_DAT_00908f40);
                auVar56 = vpcmpgtq_avx(auVar54 ^ auVar43._0_16_,auVar54 ^ auVar34);
                auVar56 = vpackssdw_avx(auVar56,auVar56);
                auVar56 = vpackssdw_avx(auVar3 ^ auVar56,auVar3 ^ auVar56);
                auVar37 = vpmovzxwd_avx2(auVar56);
                auVar37 = vpacksswb_avx2(auVar43,auVar37);
                if ((auVar37 & (undefined1  [32])0x1) != (undefined1  [32])0x0) {
                  ptr_01[uVar22 + 0x19] = auVar46[0x10];
                }
                auVar56 = vpcmpgtq_avx(auVar54 ^ auVar43._0_16_,auVar54 ^ auVar34);
                auVar56 = vpackssdw_avx(auVar56,auVar56);
                auVar56 = vpackssdw_avx(auVar3 ^ auVar56,auVar3 ^ auVar56);
                auVar37 = vpermq_avx2(ZEXT1632(auVar56),0x55);
                auVar37 = vpacksswb_avx2(auVar43,auVar37);
                if ((auVar37._16_16_ >> 8 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  ptr_01[uVar22 + 0x1a] = auVar46[0x11];
                }
                auVar43 = vpcmpgtq_avx2(local_1b8 ^ auVar43,auVar31);
                auVar37 = vpshuflw_avx2(auVar43,0xe8);
                auVar37 = vpermd_avx2(auVar45,auVar37 ^ _DAT_00909280);
                auVar56 = vpackssdw_avx(auVar37._0_16_,auVar37._0_16_);
                auVar37 = vpermq_avx2(ZEXT1632(auVar56),0x55);
                auVar37 = vpacksswb_avx2(auVar43,auVar37);
                if ((auVar37._16_16_ >> 0x10 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  ptr_01[uVar22 + 0x1b] = auVar46[0x12];
                }
                auVar56 = vpackssdw_avx(auVar43._16_16_,auVar43._16_16_);
                auVar56 = vpackssdw_avx(auVar3 ^ auVar56,auVar3 ^ auVar56);
                auVar37 = vpermq_avx2(ZEXT1632(auVar56),0x55);
                auVar37 = vpacksswb_avx2(auVar37,auVar37);
                if ((auVar37._16_16_ >> 0x18 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  ptr_01[uVar22 + 0x1c] = auVar46[0x13];
                }
                auVar43 = vpor_avx2(auVar35,_DAT_00908f20);
                auVar56 = vpcmpgtq_avx(auVar54 ^ auVar43._0_16_,auVar54 ^ auVar34);
                auVar56 = vpackssdw_avx(auVar56,auVar56);
                auVar37 = vpermq_avx2(ZEXT1632(auVar3 ^ auVar56),0x55);
                auVar37 = vpackssdw_avx2(auVar43,auVar37);
                auVar37 = vpacksswb_avx2(auVar43,auVar37);
                if ((auVar37._16_16_ >> 0x20 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  ptr_01[uVar22 + 0x1d] = auVar46[0x14];
                }
                auVar56 = vpcmpgtq_avx(auVar54 ^ auVar43._0_16_,auVar54 ^ auVar34);
                auVar56 = vpshufhw_avx(auVar56,0x84);
                auVar37 = vpermq_avx2(ZEXT1632(auVar3 ^ auVar56),0x55);
                auVar37 = vpackssdw_avx2(auVar43,auVar37);
                auVar37 = vpacksswb_avx2(auVar43,auVar37);
                if ((auVar37._16_16_ >> 0x28 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  ptr_01[uVar22 + 0x1e] = auVar46[0x15];
                }
                auVar43 = vpcmpgtq_avx2(local_1b8 ^ auVar43,auVar31);
                auVar37 = vpackssdw_avx2(auVar43,auVar43);
                auVar37 = vpackssdw_avx2(auVar43,auVar37 ^ _DAT_00909280);
                auVar37 = vpacksswb_avx2(auVar43,auVar37);
                if ((auVar37._16_16_ >> 0x30 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  ptr_01[uVar22 + 0x1f] = auVar46[0x16];
                }
                auVar37 = vpshufhw_avx2(auVar43,0x84);
                auVar37 = vpackssdw_avx2(auVar37 ^ _DAT_00909280,auVar37 ^ _DAT_00909280);
                auVar37 = vpacksswb_avx2(auVar37,auVar37);
                if ((auVar37 & (undefined1  [32])0x100000000000000) != (undefined1  [32])0x0) {
                  ptr_01[uVar22 + 0x20] = auVar46[0x17];
                }
                uVar22 = uVar22 + 0x20;
                auVar5 = vpaddd_avx2(auVar5,local_1f8);
                auVar6 = vpaddd_avx2(auVar6,local_1f8);
                local_218 = vpaddd_avx2(local_218,local_1f8);
                auVar7 = vpaddd_avx2(auVar7,local_1f8);
              } while ((s2Len + 0x1fU & 0xffffffe0) != uVar22);
              uVar22 = 0;
              auVar7[1] = cVar19;
              auVar7[0] = cVar19;
              auVar7[2] = cVar19;
              auVar7[3] = cVar19;
              auVar7[4] = cVar19;
              auVar7[5] = cVar19;
              auVar7[6] = cVar19;
              auVar7[7] = cVar19;
              auVar7[8] = cVar19;
              auVar7[9] = cVar19;
              auVar7[10] = cVar19;
              auVar7[0xb] = cVar19;
              auVar7[0xc] = cVar19;
              auVar7[0xd] = cVar19;
              auVar7[0xe] = cVar19;
              auVar7[0xf] = cVar19;
              auVar7[0x10] = cVar19;
              auVar7[0x11] = cVar19;
              auVar7[0x12] = cVar19;
              auVar7[0x13] = cVar19;
              auVar7[0x14] = cVar19;
              auVar7[0x15] = cVar19;
              auVar7[0x16] = cVar19;
              auVar7[0x17] = cVar19;
              auVar7[0x18] = cVar19;
              auVar7[0x19] = cVar19;
              auVar7[0x1a] = cVar19;
              auVar7[0x1b] = cVar19;
              auVar7[0x1c] = cVar19;
              auVar7[0x1d] = cVar19;
              auVar7[0x1e] = cVar19;
              auVar7[0x1f] = cVar19;
              auVar51 = ZEXT3264(auVar7);
              auVar6[1] = cVar26;
              auVar6[0] = cVar26;
              auVar6[2] = cVar26;
              auVar6[3] = cVar26;
              auVar6[4] = cVar26;
              auVar6[5] = cVar26;
              auVar6[6] = cVar26;
              auVar6[7] = cVar26;
              auVar6[8] = cVar26;
              auVar6[9] = cVar26;
              auVar6[10] = cVar26;
              auVar6[0xb] = cVar26;
              auVar6[0xc] = cVar26;
              auVar6[0xd] = cVar26;
              auVar6[0xe] = cVar26;
              auVar6[0xf] = cVar26;
              auVar6[0x10] = cVar26;
              auVar6[0x11] = cVar26;
              auVar6[0x12] = cVar26;
              auVar6[0x13] = cVar26;
              auVar6[0x14] = cVar26;
              auVar6[0x15] = cVar26;
              auVar6[0x16] = cVar26;
              auVar6[0x17] = cVar26;
              auVar6[0x18] = cVar26;
              auVar6[0x19] = cVar26;
              auVar6[0x1a] = cVar26;
              auVar6[0x1b] = cVar26;
              auVar6[0x1c] = cVar26;
              auVar6[0x1d] = cVar26;
              auVar6[0x1e] = cVar26;
              auVar6[0x1f] = cVar26;
              auVar58 = ZEXT3264(auVar6);
              auVar5[1] = uVar29;
              auVar5[0] = uVar29;
              auVar5[2] = uVar29;
              auVar5[3] = uVar29;
              auVar5[4] = uVar29;
              auVar5[5] = uVar29;
              auVar5[6] = uVar29;
              auVar5[7] = uVar29;
              auVar5[8] = uVar29;
              auVar5[9] = uVar29;
              auVar5[10] = uVar29;
              auVar5[0xb] = uVar29;
              auVar5[0xc] = uVar29;
              auVar5[0xd] = uVar29;
              auVar5[0xe] = uVar29;
              auVar5[0xf] = uVar29;
              auVar5[0x10] = uVar29;
              auVar5[0x11] = uVar29;
              auVar5[0x12] = uVar29;
              auVar5[0x13] = uVar29;
              auVar5[0x14] = uVar29;
              auVar5[0x15] = uVar29;
              auVar5[0x16] = uVar29;
              auVar5[0x17] = uVar29;
              auVar5[0x18] = uVar29;
              auVar5[0x19] = uVar29;
              auVar5[0x1a] = uVar29;
              auVar5[0x1b] = uVar29;
              auVar5[0x1c] = uVar29;
              auVar5[0x1d] = uVar29;
              auVar5[0x1e] = uVar29;
              auVar5[0x1f] = uVar29;
              do {
                palVar23 = ptr;
                ptr = palVar17;
                auVar34 = SUB3216(ptr[(int)size - 1],0);
                auVar45._0_16_ = ZEXT116(0) * auVar34 + ZEXT116(1) * auVar51._0_16_;
                auVar45._16_16_ = ZEXT116(0) * auVar51._16_16_ + ZEXT116(1) * auVar34;
                auVar36 = vpalignr_avx2((undefined1  [32])ptr[(int)size - 1],auVar45,0xf);
                iVar25 = ppVar2->mapper[(byte)s2[uVar22]];
                auVar34 = vpinsrb_avx(auVar36._0_16_,(uint)(byte)ptr_01[uVar22],0);
                auVar36 = vpblendd_avx2(auVar36,ZEXT1632(auVar34),0xf);
                lVar27 = 0;
                auVar38 = ZEXT3264(auVar7);
                do {
                  auVar45 = vpaddsb_avx2(auVar36,*(undefined1 (*) [32])
                                                  ((long)pvVar1 +
                                                  lVar27 + (long)iVar25 * size * 0x20));
                  auVar36 = *(undefined1 (*) [32])((long)*ptr_00 + lVar27);
                  auVar37 = auVar38._0_32_;
                  auVar46 = vpmaxsb_avx2(auVar36,auVar37);
                  auVar45 = vpmaxsb_avx2(auVar45,auVar46);
                  *(undefined1 (*) [32])((long)*palVar23 + lVar27) = auVar45;
                  auVar46 = vpmaxsb_avx2(auVar51._0_32_,auVar45);
                  auVar51 = ZEXT3264(auVar46);
                  auVar46 = vpminsb_avx2(auVar58._0_32_,auVar36);
                  auVar46 = vpminsb_avx2(auVar46,auVar37);
                  auVar46 = vpminsb_avx2(auVar46,auVar45);
                  auVar58 = ZEXT3264(auVar46);
                  auVar45 = vpsubsb_avx2(auVar45,auVar5);
                  auVar36 = vpsubsb_avx2(auVar36,auVar33);
                  auVar36 = vpmaxsb_avx2(auVar36,auVar45);
                  *(undefined1 (*) [32])((long)*ptr_00 + lVar27) = auVar36;
                  auVar36 = vpsubsb_avx2(auVar37,auVar33);
                  auVar36 = vpmaxsb_avx2(auVar36,auVar45);
                  auVar38 = ZEXT3264(auVar36);
                  auVar36 = *(undefined1 (*) [32])((long)*ptr + lVar27);
                  lVar27 = lVar27 + 0x20;
                } while (size * 0x20 != lVar27);
                iVar25 = 0;
                do {
                  iVar15 = ptr_01[uVar22 + 1] - open;
                  if (ptr_01[uVar22 + 1] - open < -0x7f) {
                    iVar15 = -0x80;
                  }
                  auVar46._0_16_ = ZEXT116(0) * auVar38._0_16_ + ZEXT116(1) * auVar51._0_16_;
                  auVar46._16_16_ = ZEXT116(0) * auVar51._16_16_ + ZEXT116(1) * auVar38._0_16_;
                  auVar36 = vpalignr_avx2(auVar38._0_32_,auVar46,0xf);
                  auVar34 = vpinsrb_avx(auVar36._0_16_,iVar15,0);
                  auVar36 = vpblendd_avx2(auVar36,ZEXT1632(auVar34),0xf);
                  auVar38 = ZEXT3264(auVar36);
                  lVar27 = 0;
                  do {
                    auVar36 = vpmaxsb_avx2(auVar38._0_32_,
                                           *(undefined1 (*) [32])((long)*palVar23 + lVar27));
                    *(undefined1 (*) [32])((long)*palVar23 + lVar27) = auVar36;
                    auVar46 = vpminsb_avx2(auVar58._0_32_,auVar36);
                    auVar58 = ZEXT3264(auVar46);
                    auVar45 = vpmaxsb_avx2(auVar51._0_32_,auVar36);
                    auVar51 = ZEXT3264(auVar45);
                    auVar36 = vpsubsb_avx2(auVar36,auVar5);
                    auVar37 = vpsubsb_avx2(auVar38._0_32_,auVar33);
                    auVar38 = ZEXT3264(auVar37);
                    auVar36 = vpcmpgtb_avx2(auVar37,auVar36);
                    if ((((((((((((((((((((((((((((((((auVar36 >> 7 & (undefined1  [32])0x1) ==
                                                      (undefined1  [32])0x0 &&
                                                     (auVar36 >> 0xf & (undefined1  [32])0x1) ==
                                                     (undefined1  [32])0x0) &&
                                                    (auVar36 >> 0x17 & (undefined1  [32])0x1) ==
                                                    (undefined1  [32])0x0) &&
                                                   (auVar36 >> 0x1f & (undefined1  [32])0x1) ==
                                                   (undefined1  [32])0x0) &&
                                                  (auVar36 >> 0x27 & (undefined1  [32])0x1) ==
                                                  (undefined1  [32])0x0) &&
                                                 (auVar36 >> 0x2f & (undefined1  [32])0x1) ==
                                                 (undefined1  [32])0x0) &&
                                                (auVar36 >> 0x37 & (undefined1  [32])0x1) ==
                                                (undefined1  [32])0x0) &&
                                               (auVar36 >> 0x3f & (undefined1  [32])0x1) ==
                                               (undefined1  [32])0x0) &&
                                              (auVar36 >> 0x47 & (undefined1  [32])0x1) ==
                                              (undefined1  [32])0x0) &&
                                             (auVar36 >> 0x4f & (undefined1  [32])0x1) ==
                                             (undefined1  [32])0x0) &&
                                            (auVar36 >> 0x57 & (undefined1  [32])0x1) ==
                                            (undefined1  [32])0x0) &&
                                           (auVar36 >> 0x5f & (undefined1  [32])0x1) ==
                                           (undefined1  [32])0x0) &&
                                          (auVar36 >> 0x67 & (undefined1  [32])0x1) ==
                                          (undefined1  [32])0x0) &&
                                         (auVar36 >> 0x6f & (undefined1  [32])0x1) ==
                                         (undefined1  [32])0x0) &&
                                        (auVar36 >> 0x77 & (undefined1  [32])0x1) ==
                                        (undefined1  [32])0x0) && SUB321(auVar36 >> 0x7f,0) == '\0')
                                      && (auVar36 >> 0x87 & (undefined1  [32])0x1) ==
                                         (undefined1  [32])0x0) &&
                                     (auVar36 >> 0x8f & (undefined1  [32])0x1) ==
                                     (undefined1  [32])0x0) &&
                                    (auVar36 >> 0x97 & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) &&
                                   (auVar36 >> 0x9f & (undefined1  [32])0x1) ==
                                   (undefined1  [32])0x0) &&
                                  (auVar36 >> 0xa7 & (undefined1  [32])0x1) == (undefined1  [32])0x0
                                  ) && (auVar36 >> 0xaf & (undefined1  [32])0x1) ==
                                       (undefined1  [32])0x0) &&
                                (auVar36 >> 0xb7 & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                               && SUB321(auVar36 >> 0xbf,0) == '\0') &&
                              (auVar36 >> 199 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                             (auVar36 >> 0xcf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                            (auVar36 >> 0xd7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                           (auVar36 >> 0xdf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar36 >> 0xe7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         (auVar36 >> 0xef & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar36 >> 0xf7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        -1 < auVar36[0x1f]) goto LAB_0077841a;
                    lVar27 = lVar27 + 0x20;
                  } while (size * 0x20 != lVar27);
                  iVar25 = iVar25 + 1;
                } while (iVar25 != 0x20);
LAB_0077841a:
                uVar22 = uVar22 + 1;
                palVar17 = palVar23;
                if (uVar22 == (uint)s2Len) {
                  alVar14 = palVar23[(ulong)uVar21 % size];
                  cVar26 = alVar14[2]._7_1_;
                  if (iVar28 < 0x1f) {
                    iVar25 = 0;
                    do {
                      auVar5 = vperm2i128_avx2((undefined1  [32])alVar14,(undefined1  [32])alVar14,
                                               0x28);
                      alVar14 = (__m256i)vpalignr_avx2((undefined1  [32])alVar14,auVar5,0xf);
                      cVar26 = alVar14[2]._7_1_;
                      iVar25 = iVar25 + 1;
                    } while (iVar25 < 0x1f - iVar28);
                  }
                  auVar5 = vpcmpgtb_avx2(auVar7,auVar46);
                  auVar6 = vpcmpgtb_avx2(auVar45,auVar6);
                  auVar5 = vpor_avx2(auVar6,auVar5);
                  if ((((((((((((((((((((((((((((((((auVar5 >> 7 & (undefined1  [32])0x1) !=
                                                    (undefined1  [32])0x0 ||
                                                   (auVar5 >> 0xf & (undefined1  [32])0x1) !=
                                                   (undefined1  [32])0x0) ||
                                                  (auVar5 >> 0x17 & (undefined1  [32])0x1) !=
                                                  (undefined1  [32])0x0) ||
                                                 (auVar5 >> 0x1f & (undefined1  [32])0x1) !=
                                                 (undefined1  [32])0x0) ||
                                                (auVar5 >> 0x27 & (undefined1  [32])0x1) !=
                                                (undefined1  [32])0x0) ||
                                               (auVar5 >> 0x2f & (undefined1  [32])0x1) !=
                                               (undefined1  [32])0x0) ||
                                              (auVar5 >> 0x37 & (undefined1  [32])0x1) !=
                                              (undefined1  [32])0x0) ||
                                             (auVar5 >> 0x3f & (undefined1  [32])0x1) !=
                                             (undefined1  [32])0x0) ||
                                            (auVar5 >> 0x47 & (undefined1  [32])0x1) !=
                                            (undefined1  [32])0x0) ||
                                           (auVar5 >> 0x4f & (undefined1  [32])0x1) !=
                                           (undefined1  [32])0x0) ||
                                          (auVar5 >> 0x57 & (undefined1  [32])0x1) !=
                                          (undefined1  [32])0x0) ||
                                         (auVar5 >> 0x5f & (undefined1  [32])0x1) !=
                                         (undefined1  [32])0x0) ||
                                        (auVar5 >> 0x67 & (undefined1  [32])0x1) !=
                                        (undefined1  [32])0x0) ||
                                       (auVar5 >> 0x6f & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                      (auVar5 >> 0x77 & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) || SUB321(auVar5 >> 0x7f,0) != '\0') ||
                                    (auVar5 >> 0x87 & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) ||
                                   (auVar5 >> 0x8f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                   ) || (auVar5 >> 0x97 & (undefined1  [32])0x1) !=
                                        (undefined1  [32])0x0) ||
                                 (auVar5 >> 0x9f & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                                || (auVar5 >> 0xa7 & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                ) || (auVar5 >> 0xaf & (undefined1  [32])0x1) !=
                                     (undefined1  [32])0x0) ||
                              (auVar5 >> 0xb7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                             SUB321(auVar5 >> 0xbf,0) != '\0') ||
                            (auVar5 >> 199 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           (auVar5 >> 0xcf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar5 >> 0xd7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar5 >> 0xdf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar5 >> 0xe7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       (auVar5 >> 0xef & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar5 >> 0xf7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      auVar5[0x1f] < '\0') {
                    *(byte *)&ppVar16->flag = (byte)ppVar16->flag | 0x40;
                    cVar26 = '\0';
                    iVar18 = 0;
                    uVar21 = 0;
                  }
                  ppVar16->score = (int)cVar26;
                  ppVar16->end_query = uVar21;
                  ppVar16->end_ref = iVar18;
                  parasail_free(ptr_01);
                  parasail_free(ptr_00);
                  parasail_free(ptr);
                  parasail_free(palVar23);
                  return ppVar16;
                }
              } while( true );
            }
          }
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m256i* restrict vProfile = NULL;
    __m256i* restrict pvHStore = NULL;
    __m256i* restrict pvHLoad = NULL;
    __m256i* restrict pvE = NULL;
    int8_t* restrict boundary = NULL;
    __m256i vGapO;
    __m256i vGapE;
    int8_t NEG_LIMIT = 0;
    int8_t POS_LIMIT = 0;
    int8_t score = 0;
    __m256i vNegLimit;
    __m256i vPosLimit;
    __m256i vSaturationCheckMin;
    __m256i vSaturationCheckMax;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile8.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 32; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    vProfile = (__m256i*)profile->profile8.score;
    vGapO = _mm256_set1_epi8(open);
    vGapE = _mm256_set1_epi8(gap);
    NEG_LIMIT = (-open < matrix->min ? INT8_MIN + open : INT8_MIN - matrix->min) + 1;
    POS_LIMIT = INT8_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    vNegLimit = _mm256_set1_epi8(NEG_LIMIT);
    vPosLimit = _mm256_set1_epi8(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_NW | PARASAIL_FLAG_STRIPED
        | PARASAIL_FLAG_BITS_8 | PARASAIL_FLAG_LANES_32;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvHStore = parasail_memalign___m256i(32, segLen);
    pvHLoad  = parasail_memalign___m256i(32, segLen);
    pvE      = parasail_memalign___m256i(32, segLen);
    boundary = parasail_memalign_int8_t(32, s2Len+1);

    /* validate heap variables */
    if (!pvHStore) return NULL;
    if (!pvHLoad) return NULL;
    if (!pvE) return NULL;
    if (!boundary) return NULL;

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m256i_8_t h;
            __m256i_8_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = -open-gap*(segNum*segLen+i);
                h.v[segNum] = tmp < INT8_MIN ? INT8_MIN : tmp;
                tmp = tmp - open;
                e.v[segNum] = tmp < INT8_MIN ? INT8_MIN : tmp;
            }
            _mm256_store_si256(&pvHStore[index], h.m);
            _mm256_store_si256(&pvE[index], e.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = -open-gap*(i-1);
            boundary[i] = tmp < INT8_MIN ? INT8_MIN : tmp;
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m256i vE;
        /* Initialize F value to -inf.  Any errors to vH values will be
         * corrected in the Lazy_F loop.  */
        __m256i vF = vNegLimit;

        /* load final segment of pvHStore and shift left by 2 bytes */
        __m256i vH = _mm256_slli_si256_rpl(pvHStore[segLen - 1], 1);

        /* Correct part of the vProfile */
        const __m256i* vP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;

        /* Swap the 2 H buffers. */
        __m256i* pv = pvHLoad;
        pvHLoad = pvHStore;
        pvHStore = pv;

        /* insert upper boundary condition */
        vH = _mm256_insert_epi8_rpl(vH, boundary[j], 0);

        /* inner loop to process the query sequence */
        for (i=0; i<segLen; ++i) {
            vH = _mm256_adds_epi8(vH, _mm256_load_si256(vP + i));
            vE = _mm256_load_si256(pvE + i);

            /* Get max from vH, vE and vF. */
            vH = _mm256_max_epi8(vH, vE);
            vH = _mm256_max_epi8(vH, vF);
            /* Save vH values. */
            _mm256_store_si256(pvHStore + i, vH);
            vSaturationCheckMax = _mm256_max_epi8(vSaturationCheckMax, vH);
            vSaturationCheckMin = _mm256_min_epi8(vSaturationCheckMin, vH);
            vSaturationCheckMin = _mm256_min_epi8(vSaturationCheckMin, vE);
            vSaturationCheckMin = _mm256_min_epi8(vSaturationCheckMin, vF);
#ifdef PARASAIL_TABLE
            arr_store_si256(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif

            /* Update vE value. */
            vH = _mm256_subs_epi8(vH, vGapO);
            vE = _mm256_subs_epi8(vE, vGapE);
            vE = _mm256_max_epi8(vE, vH);
            _mm256_store_si256(pvE + i, vE);

            /* Update vF value. */
            vF = _mm256_subs_epi8(vF, vGapE);
            vF = _mm256_max_epi8(vF, vH);

            /* Load the next vH. */
            vH = _mm256_load_si256(pvHLoad + i);
        }

        /* Lazy_F loop: has been revised to disallow adjecent insertion and
         * then deletion, so don't update E(i, i), learn from SWPS3 */
        for (k=0; k<segWidth; ++k) {
            int64_t tmp = boundary[j+1]-open;
            int8_t tmp2 = tmp < INT8_MIN ? INT8_MIN : tmp;
            vF = _mm256_slli_si256_rpl(vF, 1);
            vF = _mm256_insert_epi8_rpl(vF, tmp2, 0);
            for (i=0; i<segLen; ++i) {
                vH = _mm256_load_si256(pvHStore + i);
                vH = _mm256_max_epi8(vH,vF);
                _mm256_store_si256(pvHStore + i, vH);
                vSaturationCheckMin = _mm256_min_epi8(vSaturationCheckMin, vH);
                vSaturationCheckMax = _mm256_max_epi8(vSaturationCheckMax, vH);
#ifdef PARASAIL_TABLE
                arr_store_si256(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
                vH = _mm256_subs_epi8(vH, vGapO);
                vF = _mm256_subs_epi8(vF, vGapE);
                if (! _mm256_movemask_epi8(_mm256_cmpgt_epi8(vF, vH))) goto end;
                /*vF = _mm256_max_epi8(vF, vH);*/
            }
        }
end:
        {
        }

#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            vH = _mm256_load_si256(pvHStore + offset);
            for (k=0; k<position; ++k) {
                vH = _mm256_slli_si256_rpl(vH, 1);
            }
            result->rowcols->score_row[j] = (int8_t) _mm256_extract_epi8_rpl (vH, 31);
        }
#endif
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m256i vH = _mm256_load_si256(pvHStore+i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen);
    }
#endif

    /* extract last value from the last column */
    {
        __m256i vH = _mm256_load_si256(pvHStore + offset);
        for (k=0; k<position; ++k) {
            vH = _mm256_slli_si256_rpl (vH, 1);
        }
        score = (int8_t) _mm256_extract_epi8_rpl (vH, 31);
    }

    if (_mm256_movemask_epi8(_mm256_or_si256(
            _mm256_cmplt_epi8_rpl(vSaturationCheckMin, vNegLimit),
            _mm256_cmpgt_epi8(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(boundary);
    parasail_free(pvE);
    parasail_free(pvHLoad);
    parasail_free(pvHStore);

    return result;
}